

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O3

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxInfeas(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *__return_storage_ptr__,
           SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int32_t iVar6;
  int iVar7;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar8;
  pointer pnVar9;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar10;
  long lVar11;
  cpp_dec_float<50U,_int,_void> *pcVar12;
  cpp_dec_float<50U,_int,_void> *pcVar13;
  pointer pnVar14;
  long lVar15;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 10;
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x1d) = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x25) = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)__return_storage_ptr__,0.0);
  if (this->theType == ENTER) {
    if ((this->m_pricingViolUpToDate != false) && (this->m_pricingViolCoUpToDate == true)) {
      pnVar1 = &this->m_pricingViol;
      pnVar2 = &this->m_pricingViolCo;
      local_a8.fpclass = cpp_dec_float_finite;
      local_a8.prec_elem = 10;
      local_a8.data._M_elems[0] = 0;
      local_a8.data._M_elems[1] = 0;
      local_a8.data._M_elems[2] = 0;
      local_a8.data._M_elems[3] = 0;
      local_a8.data._M_elems[4] = 0;
      local_a8.data._M_elems[5] = 0;
      local_a8.data._M_elems._24_5_ = 0;
      local_a8.data._M_elems[7]._1_3_ = 0;
      local_a8.data._M_elems._32_5_ = 0;
      local_a8.data._M_elems[9]._1_3_ = 0;
      local_a8.exp = 0;
      local_a8.neg = false;
      pcVar13 = &pnVar1->m_backend;
      if ((&local_a8 != &pnVar2->m_backend) &&
         (pcVar13 = &pnVar2->m_backend, &local_a8 != &pnVar1->m_backend)) {
        uVar3 = *(undefined8 *)((this->m_pricingViol).m_backend.data._M_elems + 8);
        local_a8.data._M_elems._32_5_ = SUB85(uVar3,0);
        local_a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_a8.data._M_elems._0_8_ = *(undefined8 *)(pnVar1->m_backend).data._M_elems;
        local_a8.data._M_elems._8_8_ =
             *(undefined8 *)((this->m_pricingViol).m_backend.data._M_elems + 2);
        local_a8.data._M_elems._16_8_ =
             *(undefined8 *)((this->m_pricingViol).m_backend.data._M_elems + 4);
        uVar3 = *(undefined8 *)((this->m_pricingViol).m_backend.data._M_elems + 6);
        local_a8.data._M_elems._24_5_ = SUB85(uVar3,0);
        local_a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
        local_a8.exp = (this->m_pricingViol).m_backend.exp;
        local_a8.neg = (this->m_pricingViol).m_backend.neg;
        local_a8.fpclass = (this->m_pricingViol).m_backend.fpclass;
        local_a8.prec_elem = (this->m_pricingViol).m_backend.prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=(&local_a8,pcVar13);
      *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
           local_a8.data._M_elems._0_8_;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
           local_a8.data._M_elems._8_8_;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
           local_a8.data._M_elems._16_8_;
      *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
           CONCAT35(local_a8.data._M_elems[7]._1_3_,local_a8.data._M_elems._24_5_);
      *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
           CONCAT35(local_a8.data._M_elems[9]._1_3_,local_a8.data._M_elems._32_5_);
      (__return_storage_ptr__->m_backend).exp = local_a8.exp;
      (__return_storage_ptr__->m_backend).neg = local_a8.neg;
      (__return_storage_ptr__->m_backend).fpclass = local_a8.fpclass;
      (__return_storage_ptr__->m_backend).prec_elem = local_a8.prec_elem;
    }
    if (0 < (this->thecovectors->set).thenum) {
      lVar15 = 0;
      lVar11 = 0;
      do {
        pnVar9 = (this->theFvec->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar7 = *(int *)((long)&pnVar9->m_backend + lVar15 + 0x30);
        if ((iVar7 == 2) ||
           (pnVar14 = (this->theUBbound).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
           *(int *)((long)&(pnVar14->m_backend).data + lVar15 + 0x30) == 2)) {
LAB_0026180b:
          if (((iVar7 != 2) &&
              (pnVar14 = (this->theLBbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
              *(int *)((long)&(pnVar14->m_backend).data + lVar15 + 0x30) != 2)) &&
             (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                ((cpp_dec_float<50U,_int,_void> *)
                                 ((long)&pnVar9->m_backend + lVar15),
                                 (cpp_dec_float<50U,_int,_void> *)
                                 ((long)&(pnVar14->m_backend).data + lVar15)), iVar7 < 0)) {
            pnVar9 = (this->theLBbound).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pcVar13 = (cpp_dec_float<50U,_int,_void> *)((long)&(pnVar9->m_backend).data + lVar15);
            pcVar12 = (cpp_dec_float<50U,_int,_void> *)
                      ((long)&((this->theFvec->
                               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar15);
            local_68.fpclass = cpp_dec_float_finite;
            local_68.prec_elem = 10;
            local_68.data._M_elems[0] = 0;
            local_68.data._M_elems[1] = 0;
            local_68.data._M_elems[2] = 0;
            local_68.data._M_elems[3] = 0;
            local_68.data._M_elems[4] = 0;
            local_68.data._M_elems[5] = 0;
            local_68.data._M_elems._24_5_ = 0;
            local_68.data._M_elems[7]._1_3_ = 0;
            local_68.data._M_elems._32_5_ = 0;
            local_68.data._M_elems[9]._1_3_ = 0;
            local_68.exp = 0;
            local_68.neg = false;
            if (pcVar12 == &local_68) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_68,pcVar13);
              if (local_68.data._M_elems[0] != 0 || local_68.fpclass != cpp_dec_float_finite) {
                local_68.neg = (bool)(local_68.neg ^ 1);
              }
            }
            else {
              if (pcVar13 != &local_68) {
                uVar3 = *(undefined8 *)((pcVar13->data)._M_elems + 8);
                local_68.data._M_elems._32_5_ = SUB85(uVar3,0);
                local_68.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_68.data._M_elems._0_8_ = *(undefined8 *)(pcVar13->data)._M_elems;
                local_68.data._M_elems._8_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 2);
                local_68.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
                uVar3 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
                local_68.data._M_elems._24_5_ = SUB85(uVar3,0);
                local_68.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_68.exp = *(int *)((long)&(pnVar9->m_backend).data + lVar15 + 0x28);
                local_68.neg = *(bool *)((long)&(pnVar9->m_backend).data + lVar15 + 0x2c);
                local_68._48_8_ = *(undefined8 *)((long)&(pnVar9->m_backend).data + lVar15 + 0x30);
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_68,pcVar12);
            }
            if ((((__return_storage_ptr__->m_backend).fpclass == cpp_dec_float_NaN) ||
                (local_68.fpclass == cpp_dec_float_NaN)) ||
               (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&__return_storage_ptr__->m_backend,&local_68), iVar7 < 1)) {
              pnVar9 = (this->theLBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pnVar14 = (this->theFvec->
                        super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              goto LAB_00261991;
            }
LAB_00261947:
            uVar3 = *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8);
            local_a8.data._M_elems._32_5_ = SUB85(uVar3,0);
            local_a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_a8.data._M_elems._0_8_ =
                 *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems;
            local_a8.data._M_elems._8_8_ =
                 *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2);
            local_a8.data._M_elems._16_8_ =
                 *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4);
            uVar3 = *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6);
            local_a8.data._M_elems._24_5_ = SUB85(uVar3,0);
            local_a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_a8.exp = (__return_storage_ptr__->m_backend).exp;
            local_a8.neg = (__return_storage_ptr__->m_backend).neg;
            local_a8.fpclass = (__return_storage_ptr__->m_backend).fpclass;
            local_a8.prec_elem = (__return_storage_ptr__->m_backend).prec_elem;
            goto LAB_00261a16;
          }
        }
        else {
          iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            ((cpp_dec_float<50U,_int,_void> *)((long)&pnVar9->m_backend + lVar15),
                             (cpp_dec_float<50U,_int,_void> *)
                             ((long)&(pnVar14->m_backend).data + lVar15));
          if (iVar7 < 1) {
            pnVar9 = (this->theFvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar7 = *(int *)((long)&pnVar9->m_backend + lVar15 + 0x30);
            goto LAB_0026180b;
          }
          pnVar9 = (this->theFvec->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pcVar13 = (cpp_dec_float<50U,_int,_void> *)((long)&pnVar9->m_backend + lVar15);
          pcVar12 = (cpp_dec_float<50U,_int,_void> *)
                    ((long)&(((this->theUBbound).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar15);
          local_68.fpclass = cpp_dec_float_finite;
          local_68.prec_elem = 10;
          local_68.data._M_elems[0] = 0;
          local_68.data._M_elems[1] = 0;
          local_68.data._M_elems[2] = 0;
          local_68.data._M_elems[3] = 0;
          local_68.data._M_elems[4] = 0;
          local_68.data._M_elems[5] = 0;
          local_68.data._M_elems._24_5_ = 0;
          local_68.data._M_elems[7]._1_3_ = 0;
          local_68.data._M_elems._32_5_ = 0;
          local_68.data._M_elems[9]._1_3_ = 0;
          local_68.exp = 0;
          local_68.neg = false;
          if (pcVar12 == &local_68) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_68,pcVar13);
            if (local_68.data._M_elems[0] != 0 || local_68.fpclass != cpp_dec_float_finite) {
              local_68.neg = (bool)(local_68.neg ^ 1);
            }
          }
          else {
            if (pcVar13 != &local_68) {
              uVar3 = *(undefined8 *)((pcVar13->data)._M_elems + 8);
              local_68.data._M_elems._32_5_ = SUB85(uVar3,0);
              local_68.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_68.data._M_elems._0_8_ = *(undefined8 *)(pcVar13->data)._M_elems;
              local_68.data._M_elems._8_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 2);
              local_68.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
              uVar3 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
              local_68.data._M_elems._24_5_ = SUB85(uVar3,0);
              local_68.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_68.exp = *(int *)((long)&pnVar9->m_backend + lVar15 + 0x28);
              local_68.neg = *(bool *)((long)&pnVar9->m_backend + lVar15 + 0x2c);
              local_68._48_8_ = *(undefined8 *)((long)&pnVar9->m_backend + lVar15 + 0x30);
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_68,pcVar12);
          }
          if ((((__return_storage_ptr__->m_backend).fpclass != cpp_dec_float_NaN) &&
              (local_68.fpclass != cpp_dec_float_NaN)) &&
             (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&__return_storage_ptr__->m_backend,&local_68), 0 < iVar7))
          goto LAB_00261947;
          pnVar9 = (this->theFvec->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pnVar14 = (this->theUBbound).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
LAB_00261991:
          pcVar13 = (cpp_dec_float<50U,_int,_void> *)((long)&(pnVar9->m_backend).data + lVar15);
          pcVar12 = (cpp_dec_float<50U,_int,_void> *)((long)&(pnVar14->m_backend).data + lVar15);
          local_a8.fpclass = cpp_dec_float_finite;
          local_a8.prec_elem = 10;
          local_a8.data._M_elems[0] = 0;
          local_a8.data._M_elems[1] = 0;
          local_a8.data._M_elems[2] = 0;
          local_a8.data._M_elems[3] = 0;
          local_a8.data._M_elems[4] = 0;
          local_a8.data._M_elems[5] = 0;
          local_a8.data._M_elems._24_5_ = 0;
          local_a8.data._M_elems[7]._1_3_ = 0;
          local_a8.data._M_elems._32_5_ = 0;
          local_a8.data._M_elems[9]._1_3_ = 0;
          local_a8.exp = 0;
          local_a8.neg = false;
          if (pcVar12 == &local_a8) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_a8,pcVar13);
            if (local_a8.data._M_elems[0] != 0 || local_a8.fpclass != cpp_dec_float_finite) {
              local_a8.neg = (bool)(local_a8.neg ^ 1);
            }
          }
          else {
            if (pcVar13 != &local_a8) {
              uVar3 = *(undefined8 *)((pcVar13->data)._M_elems + 8);
              local_a8.data._M_elems._32_5_ = SUB85(uVar3,0);
              local_a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_a8.data._M_elems._0_8_ = *(undefined8 *)(pcVar13->data)._M_elems;
              local_a8.data._M_elems._8_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 2);
              local_a8.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
              uVar3 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
              local_a8.data._M_elems._24_5_ = SUB85(uVar3,0);
              local_a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_a8.exp = *(int *)((long)&(pnVar9->m_backend).data + lVar15 + 0x28);
              local_a8.neg = *(bool *)((long)&(pnVar9->m_backend).data + lVar15 + 0x2c);
              local_a8._48_8_ = *(undefined8 *)((long)&(pnVar9->m_backend).data + lVar15 + 0x30);
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_a8,pcVar12);
          }
LAB_00261a16:
          *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
               CONCAT35(local_a8.data._M_elems[9]._1_3_,local_a8.data._M_elems._32_5_);
          *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
               local_a8.data._M_elems._16_8_;
          *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
               CONCAT35(local_a8.data._M_elems[7]._1_3_,local_a8.data._M_elems._24_5_);
          *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
               local_a8.data._M_elems._0_8_;
          *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
               local_a8.data._M_elems._8_8_;
          (__return_storage_ptr__->m_backend).exp = local_a8.exp;
          (__return_storage_ptr__->m_backend).neg = local_a8.neg;
          (__return_storage_ptr__->m_backend).fpclass = local_a8.fpclass;
          (__return_storage_ptr__->m_backend).prec_elem = local_a8.prec_elem;
        }
        lVar11 = lVar11 + 1;
        lVar15 = lVar15 + 0x38;
      } while (lVar11 < (this->thecovectors->set).thenum);
    }
  }
  else {
    if (this->m_pricingViolUpToDate != false) {
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
           *(undefined8 *)((this->m_pricingViol).m_backend.data._M_elems + 8);
      uVar3 = *(undefined8 *)(this->m_pricingViol).m_backend.data._M_elems;
      uVar4 = *(undefined8 *)((this->m_pricingViol).m_backend.data._M_elems + 2);
      uVar5 = *(undefined8 *)((this->m_pricingViol).m_backend.data._M_elems + 6);
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
           *(undefined8 *)((this->m_pricingViol).m_backend.data._M_elems + 4);
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6) = uVar5;
      *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems = uVar3;
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) = uVar4;
      (__return_storage_ptr__->m_backend).exp = (this->m_pricingViol).m_backend.exp;
      (__return_storage_ptr__->m_backend).neg = (this->m_pricingViol).m_backend.neg;
      iVar6 = (this->m_pricingViol).m_backend.prec_elem;
      (__return_storage_ptr__->m_backend).fpclass = (this->m_pricingViol).m_backend.fpclass;
      (__return_storage_ptr__->m_backend).prec_elem = iVar6;
    }
    if (0 < (this->thecovectors->set).thenum) {
      lVar11 = 0;
      lVar15 = 0;
      do {
        pnVar9 = (this->theCoPvec->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar7 = *(int *)((long)&pnVar9->m_backend + lVar11 + 0x30);
        if ((iVar7 == 2) ||
           (pnVar14 = (this->theCoUbound->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
           *(int *)((long)&(pnVar14->m_backend).data + lVar11 + 0x30) == 2)) {
LAB_002610c3:
          if (((iVar7 != 2) &&
              (pnVar14 = (this->theCoLbound->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
              *(int *)((long)&(pnVar14->m_backend).data + lVar11 + 0x30) != 2)) &&
             (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                ((cpp_dec_float<50U,_int,_void> *)
                                 ((long)&pnVar9->m_backend + lVar11),
                                 (cpp_dec_float<50U,_int,_void> *)
                                 ((long)&(pnVar14->m_backend).data + lVar11)), iVar7 < 0)) {
            pnVar9 = (this->theCoLbound->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pcVar13 = (cpp_dec_float<50U,_int,_void> *)((long)&(pnVar9->m_backend).data + lVar11);
            pcVar12 = (cpp_dec_float<50U,_int,_void> *)
                      ((long)&((this->theCoPvec->
                               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar11);
            local_68.fpclass = cpp_dec_float_finite;
            local_68.prec_elem = 10;
            local_68.data._M_elems[0] = 0;
            local_68.data._M_elems[1] = 0;
            local_68.data._M_elems[2] = 0;
            local_68.data._M_elems[3] = 0;
            local_68.data._M_elems[4] = 0;
            local_68.data._M_elems[5] = 0;
            local_68.data._M_elems._24_5_ = 0;
            local_68.data._M_elems[7]._1_3_ = 0;
            local_68.data._M_elems._32_5_ = 0;
            local_68.data._M_elems[9]._1_3_ = 0;
            local_68.exp = 0;
            local_68.neg = false;
            if (pcVar12 == &local_68) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_68,pcVar13);
              if (local_68.data._M_elems[0] != 0 || local_68.fpclass != cpp_dec_float_finite) {
                local_68.neg = (bool)(local_68.neg ^ 1);
              }
            }
            else {
              if (pcVar13 != &local_68) {
                uVar3 = *(undefined8 *)((pcVar13->data)._M_elems + 8);
                local_68.data._M_elems._32_5_ = SUB85(uVar3,0);
                local_68.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_68.data._M_elems._0_8_ = *(undefined8 *)(pcVar13->data)._M_elems;
                local_68.data._M_elems._8_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 2);
                local_68.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
                uVar3 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
                local_68.data._M_elems._24_5_ = SUB85(uVar3,0);
                local_68.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_68.exp = *(int *)((long)&(pnVar9->m_backend).data + lVar11 + 0x28);
                local_68.neg = *(bool *)((long)&(pnVar9->m_backend).data + lVar11 + 0x2c);
                local_68._48_8_ = *(undefined8 *)((long)&(pnVar9->m_backend).data + lVar11 + 0x30);
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_68,pcVar12);
            }
            if ((((__return_storage_ptr__->m_backend).fpclass == cpp_dec_float_NaN) ||
                (local_68.fpclass == cpp_dec_float_NaN)) ||
               (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&__return_storage_ptr__->m_backend,&local_68), iVar7 < 1)) {
              pUVar10 = this->theCoPvec;
              pUVar8 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)this->theCoLbound;
              goto LAB_0026123b;
            }
LAB_002611f8:
            uVar3 = *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8);
            local_a8.data._M_elems._32_5_ = SUB85(uVar3,0);
            local_a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_a8.data._M_elems._0_8_ =
                 *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems;
            local_a8.data._M_elems._8_8_ =
                 *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2);
            local_a8.data._M_elems._16_8_ =
                 *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4);
            uVar3 = *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6);
            local_a8.data._M_elems._24_5_ = SUB85(uVar3,0);
            local_a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_a8.exp = (__return_storage_ptr__->m_backend).exp;
            local_a8.neg = (__return_storage_ptr__->m_backend).neg;
            local_a8.fpclass = (__return_storage_ptr__->m_backend).fpclass;
            local_a8.prec_elem = (__return_storage_ptr__->m_backend).prec_elem;
            goto LAB_002612c8;
          }
        }
        else {
          iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            ((cpp_dec_float<50U,_int,_void> *)((long)&pnVar9->m_backend + lVar11),
                             (cpp_dec_float<50U,_int,_void> *)
                             ((long)&(pnVar14->m_backend).data + lVar11));
          if (iVar7 < 1) {
            pnVar9 = (this->theCoPvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar7 = *(int *)((long)&pnVar9->m_backend + lVar11 + 0x30);
            goto LAB_002610c3;
          }
          pnVar9 = (this->theCoPvec->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pcVar13 = (cpp_dec_float<50U,_int,_void> *)((long)&pnVar9->m_backend + lVar11);
          pcVar12 = (cpp_dec_float<50U,_int,_void> *)
                    ((long)&(((this->theCoUbound->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar11);
          local_68.fpclass = cpp_dec_float_finite;
          local_68.prec_elem = 10;
          local_68.data._M_elems[0] = 0;
          local_68.data._M_elems[1] = 0;
          local_68.data._M_elems[2] = 0;
          local_68.data._M_elems[3] = 0;
          local_68.data._M_elems[4] = 0;
          local_68.data._M_elems[5] = 0;
          local_68.data._M_elems._24_5_ = 0;
          local_68.data._M_elems[7]._1_3_ = 0;
          local_68.data._M_elems._32_5_ = 0;
          local_68.data._M_elems[9]._1_3_ = 0;
          local_68.exp = 0;
          local_68.neg = false;
          if (pcVar12 == &local_68) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_68,pcVar13);
            if (local_68.data._M_elems[0] != 0 || local_68.fpclass != cpp_dec_float_finite) {
              local_68.neg = (bool)(local_68.neg ^ 1);
            }
          }
          else {
            if (pcVar13 != &local_68) {
              uVar3 = *(undefined8 *)((pcVar13->data)._M_elems + 8);
              local_68.data._M_elems._32_5_ = SUB85(uVar3,0);
              local_68.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_68.data._M_elems._0_8_ = *(undefined8 *)(pcVar13->data)._M_elems;
              local_68.data._M_elems._8_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 2);
              local_68.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
              uVar3 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
              local_68.data._M_elems._24_5_ = SUB85(uVar3,0);
              local_68.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_68.exp = *(int *)((long)&pnVar9->m_backend + lVar11 + 0x28);
              local_68.neg = *(bool *)((long)&pnVar9->m_backend + lVar11 + 0x2c);
              local_68._48_8_ = *(undefined8 *)((long)&pnVar9->m_backend + lVar11 + 0x30);
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_68,pcVar12);
          }
          if ((((__return_storage_ptr__->m_backend).fpclass != cpp_dec_float_NaN) &&
              (local_68.fpclass != cpp_dec_float_NaN)) &&
             (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&__return_storage_ptr__->m_backend,&local_68), 0 < iVar7))
          goto LAB_002611f8;
          pUVar8 = this->theCoPvec;
          pUVar10 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)this->theCoUbound;
LAB_0026123b:
          pnVar9 = (pUVar8->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pcVar13 = (cpp_dec_float<50U,_int,_void> *)((long)&pnVar9->m_backend + lVar11);
          pcVar12 = (cpp_dec_float<50U,_int,_void> *)
                    ((long)&(((pUVar10->
                              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar11);
          local_a8.fpclass = cpp_dec_float_finite;
          local_a8.prec_elem = 10;
          local_a8.data._M_elems[0] = 0;
          local_a8.data._M_elems[1] = 0;
          local_a8.data._M_elems[2] = 0;
          local_a8.data._M_elems[3] = 0;
          local_a8.data._M_elems[4] = 0;
          local_a8.data._M_elems[5] = 0;
          local_a8.data._M_elems._24_5_ = 0;
          local_a8.data._M_elems[7]._1_3_ = 0;
          local_a8.data._M_elems._32_5_ = 0;
          local_a8.data._M_elems[9]._1_3_ = 0;
          local_a8.exp = 0;
          local_a8.neg = false;
          if (pcVar12 == &local_a8) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_a8,pcVar13);
            if (local_a8.data._M_elems[0] != 0 || local_a8.fpclass != cpp_dec_float_finite) {
              local_a8.neg = (bool)(local_a8.neg ^ 1);
            }
          }
          else {
            if (pcVar13 != &local_a8) {
              uVar3 = *(undefined8 *)((pcVar13->data)._M_elems + 8);
              local_a8.data._M_elems._32_5_ = SUB85(uVar3,0);
              local_a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_a8.data._M_elems._0_8_ = *(undefined8 *)(pcVar13->data)._M_elems;
              local_a8.data._M_elems._8_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 2);
              local_a8.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
              uVar3 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
              local_a8.data._M_elems._24_5_ = SUB85(uVar3,0);
              local_a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_a8.exp = *(int *)((long)&pnVar9->m_backend + lVar11 + 0x28);
              local_a8.neg = *(bool *)((long)&pnVar9->m_backend + lVar11 + 0x2c);
              local_a8._48_8_ = *(undefined8 *)((long)&pnVar9->m_backend + lVar11 + 0x30);
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_a8,pcVar12);
          }
LAB_002612c8:
          *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
               CONCAT35(local_a8.data._M_elems[9]._1_3_,local_a8.data._M_elems._32_5_);
          *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
               local_a8.data._M_elems._16_8_;
          *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
               CONCAT35(local_a8.data._M_elems[7]._1_3_,local_a8.data._M_elems._24_5_);
          *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
               local_a8.data._M_elems._0_8_;
          *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
               local_a8.data._M_elems._8_8_;
          (__return_storage_ptr__->m_backend).exp = local_a8.exp;
          (__return_storage_ptr__->m_backend).neg = local_a8.neg;
          (__return_storage_ptr__->m_backend).fpclass = local_a8.fpclass;
          (__return_storage_ptr__->m_backend).prec_elem = local_a8.prec_elem;
        }
        lVar15 = lVar15 + 1;
        lVar11 = lVar11 + 0x38;
      } while (lVar15 < (this->thecovectors->set).thenum);
    }
    if (0 < (this->thevectors->set).thenum) {
      lVar11 = 0;
      lVar15 = 0;
      do {
        pnVar9 = (this->thePvec->
                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        iVar7 = *(int *)((long)&pnVar9->m_backend + lVar11 + 0x30);
        if ((iVar7 == 2) ||
           (pnVar14 = (this->theUbound->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
           *(int *)((long)&(pnVar14->m_backend).data + lVar11 + 0x30) == 2)) {
LAB_00261402:
          if (((iVar7 != 2) &&
              (pnVar14 = (this->theLbound->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
              *(int *)((long)&(pnVar14->m_backend).data + lVar11 + 0x30) != 2)) &&
             (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                ((cpp_dec_float<50U,_int,_void> *)
                                 ((long)&pnVar9->m_backend + lVar11),
                                 (cpp_dec_float<50U,_int,_void> *)
                                 ((long)&(pnVar14->m_backend).data + lVar11)), iVar7 < 0)) {
            pnVar9 = (this->theLbound->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pcVar13 = (cpp_dec_float<50U,_int,_void> *)((long)&(pnVar9->m_backend).data + lVar11);
            pcVar12 = (cpp_dec_float<50U,_int,_void> *)
                      ((long)&((this->thePvec->
                               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_backend + lVar11);
            local_68.fpclass = cpp_dec_float_finite;
            local_68.prec_elem = 10;
            local_68.data._M_elems[0] = 0;
            local_68.data._M_elems[1] = 0;
            local_68.data._M_elems[2] = 0;
            local_68.data._M_elems[3] = 0;
            local_68.data._M_elems[4] = 0;
            local_68.data._M_elems[5] = 0;
            local_68.data._M_elems._24_5_ = 0;
            local_68.data._M_elems[7]._1_3_ = 0;
            local_68.data._M_elems._32_5_ = 0;
            local_68.data._M_elems[9]._1_3_ = 0;
            local_68.exp = 0;
            local_68.neg = false;
            if (pcVar12 == &local_68) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_68,pcVar13);
              if (local_68.data._M_elems[0] != 0 || local_68.fpclass != cpp_dec_float_finite) {
                local_68.neg = (bool)(local_68.neg ^ 1);
              }
            }
            else {
              if (pcVar13 != &local_68) {
                uVar3 = *(undefined8 *)((pcVar13->data)._M_elems + 8);
                local_68.data._M_elems._32_5_ = SUB85(uVar3,0);
                local_68.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_68.data._M_elems._0_8_ = *(undefined8 *)(pcVar13->data)._M_elems;
                local_68.data._M_elems._8_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 2);
                local_68.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
                uVar3 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
                local_68.data._M_elems._24_5_ = SUB85(uVar3,0);
                local_68.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
                local_68.exp = *(int *)((long)&(pnVar9->m_backend).data + lVar11 + 0x28);
                local_68.neg = *(bool *)((long)&(pnVar9->m_backend).data + lVar11 + 0x2c);
                local_68._48_8_ = *(undefined8 *)((long)&(pnVar9->m_backend).data + lVar11 + 0x30);
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (&local_68,pcVar12);
            }
            if ((((__return_storage_ptr__->m_backend).fpclass == cpp_dec_float_NaN) ||
                (local_68.fpclass == cpp_dec_float_NaN)) ||
               (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  (&__return_storage_ptr__->m_backend,&local_68), iVar7 < 1)) {
              pUVar10 = this->thePvec;
              pUVar8 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)this->theLbound;
              goto LAB_0026157a;
            }
LAB_00261537:
            uVar3 = *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8);
            local_a8.data._M_elems._32_5_ = SUB85(uVar3,0);
            local_a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_a8.data._M_elems._0_8_ =
                 *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems;
            local_a8.data._M_elems._8_8_ =
                 *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2);
            local_a8.data._M_elems._16_8_ =
                 *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4);
            uVar3 = *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6);
            local_a8.data._M_elems._24_5_ = SUB85(uVar3,0);
            local_a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
            local_a8.exp = (__return_storage_ptr__->m_backend).exp;
            local_a8.neg = (__return_storage_ptr__->m_backend).neg;
            local_a8.fpclass = (__return_storage_ptr__->m_backend).fpclass;
            local_a8.prec_elem = (__return_storage_ptr__->m_backend).prec_elem;
            goto LAB_00261607;
          }
        }
        else {
          iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            ((cpp_dec_float<50U,_int,_void> *)((long)&pnVar9->m_backend + lVar11),
                             (cpp_dec_float<50U,_int,_void> *)
                             ((long)&(pnVar14->m_backend).data + lVar11));
          if (iVar7 < 1) {
            pnVar9 = (this->thePvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            iVar7 = *(int *)((long)&pnVar9->m_backend + lVar11 + 0x30);
            goto LAB_00261402;
          }
          pnVar9 = (this->thePvec->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pcVar13 = (cpp_dec_float<50U,_int,_void> *)((long)&pnVar9->m_backend + lVar11);
          pcVar12 = (cpp_dec_float<50U,_int,_void> *)
                    ((long)&(((this->theUbound->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar11);
          local_68.fpclass = cpp_dec_float_finite;
          local_68.prec_elem = 10;
          local_68.data._M_elems[0] = 0;
          local_68.data._M_elems[1] = 0;
          local_68.data._M_elems[2] = 0;
          local_68.data._M_elems[3] = 0;
          local_68.data._M_elems[4] = 0;
          local_68.data._M_elems[5] = 0;
          local_68.data._M_elems._24_5_ = 0;
          local_68.data._M_elems[7]._1_3_ = 0;
          local_68.data._M_elems._32_5_ = 0;
          local_68.data._M_elems[9]._1_3_ = 0;
          local_68.exp = 0;
          local_68.neg = false;
          if (pcVar12 == &local_68) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_68,pcVar13);
            if (local_68.data._M_elems[0] != 0 || local_68.fpclass != cpp_dec_float_finite) {
              local_68.neg = (bool)(local_68.neg ^ 1);
            }
          }
          else {
            if (pcVar13 != &local_68) {
              uVar3 = *(undefined8 *)((pcVar13->data)._M_elems + 8);
              local_68.data._M_elems._32_5_ = SUB85(uVar3,0);
              local_68.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_68.data._M_elems._0_8_ = *(undefined8 *)(pcVar13->data)._M_elems;
              local_68.data._M_elems._8_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 2);
              local_68.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
              uVar3 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
              local_68.data._M_elems._24_5_ = SUB85(uVar3,0);
              local_68.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_68.exp = *(int *)((long)&pnVar9->m_backend + lVar11 + 0x28);
              local_68.neg = *(bool *)((long)&pnVar9->m_backend + lVar11 + 0x2c);
              local_68._48_8_ = *(undefined8 *)((long)&pnVar9->m_backend + lVar11 + 0x30);
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_68,pcVar12);
          }
          if ((((__return_storage_ptr__->m_backend).fpclass != cpp_dec_float_NaN) &&
              (local_68.fpclass != cpp_dec_float_NaN)) &&
             (iVar7 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                (&__return_storage_ptr__->m_backend,&local_68), 0 < iVar7))
          goto LAB_00261537;
          pUVar8 = this->thePvec;
          pUVar10 = (UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)this->theUbound;
LAB_0026157a:
          pnVar9 = (pUVar8->
                   super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pcVar13 = (cpp_dec_float<50U,_int,_void> *)((long)&pnVar9->m_backend + lVar11);
          pcVar12 = (cpp_dec_float<50U,_int,_void> *)
                    ((long)&(((pUVar10->
                              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + lVar11);
          local_a8.fpclass = cpp_dec_float_finite;
          local_a8.prec_elem = 10;
          local_a8.data._M_elems[0] = 0;
          local_a8.data._M_elems[1] = 0;
          local_a8.data._M_elems[2] = 0;
          local_a8.data._M_elems[3] = 0;
          local_a8.data._M_elems[4] = 0;
          local_a8.data._M_elems[5] = 0;
          local_a8.data._M_elems._24_5_ = 0;
          local_a8.data._M_elems[7]._1_3_ = 0;
          local_a8.data._M_elems._32_5_ = 0;
          local_a8.data._M_elems[9]._1_3_ = 0;
          local_a8.exp = 0;
          local_a8.neg = false;
          if (pcVar12 == &local_a8) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_a8,pcVar13);
            if (local_a8.data._M_elems[0] != 0 || local_a8.fpclass != cpp_dec_float_finite) {
              local_a8.neg = (bool)(local_a8.neg ^ 1);
            }
          }
          else {
            if (pcVar13 != &local_a8) {
              uVar3 = *(undefined8 *)((pcVar13->data)._M_elems + 8);
              local_a8.data._M_elems._32_5_ = SUB85(uVar3,0);
              local_a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_a8.data._M_elems._0_8_ = *(undefined8 *)(pcVar13->data)._M_elems;
              local_a8.data._M_elems._8_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 2);
              local_a8.data._M_elems._16_8_ = *(undefined8 *)((pcVar13->data)._M_elems + 4);
              uVar3 = *(undefined8 *)((pcVar13->data)._M_elems + 6);
              local_a8.data._M_elems._24_5_ = SUB85(uVar3,0);
              local_a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
              local_a8.exp = *(int *)((long)&pnVar9->m_backend + lVar11 + 0x28);
              local_a8.neg = *(bool *)((long)&pnVar9->m_backend + lVar11 + 0x2c);
              local_a8._48_8_ = *(undefined8 *)((long)&pnVar9->m_backend + lVar11 + 0x30);
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&local_a8,pcVar12);
          }
LAB_00261607:
          *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 8) =
               CONCAT35(local_a8.data._M_elems[9]._1_3_,local_a8.data._M_elems._32_5_);
          *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4) =
               local_a8.data._M_elems._16_8_;
          *(ulong *)((__return_storage_ptr__->m_backend).data._M_elems + 6) =
               CONCAT35(local_a8.data._M_elems[7]._1_3_,local_a8.data._M_elems._24_5_);
          *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems =
               local_a8.data._M_elems._0_8_;
          *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2) =
               local_a8.data._M_elems._8_8_;
          (__return_storage_ptr__->m_backend).exp = local_a8.exp;
          (__return_storage_ptr__->m_backend).neg = local_a8.neg;
          (__return_storage_ptr__->m_backend).fpclass = local_a8.fpclass;
          (__return_storage_ptr__->m_backend).prec_elem = local_a8.prec_elem;
        }
        lVar15 = lVar15 + 1;
        lVar11 = lVar11 + 0x38;
      } while (lVar15 < (this->thevectors->set).thenum);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

R SPxSolverBase<R>::maxInfeas() const
   {
      R inf = 0.0;

      if(type() == ENTER)
      {
         if(m_pricingViolUpToDate && m_pricingViolCoUpToDate)
            inf = m_pricingViol + m_pricingViolCo;

         for(int i = 0; i < dim(); i++)
         {
            if((*theFvec)[i] > theUBbound[i])
               inf = SOPLEX_MAX(inf, (*theFvec)[i] - theUBbound[i]);
            else if((*theFvec)[i] < theLBbound[i])
               inf = SOPLEX_MAX(inf, theLBbound[i] - (*theFvec)[i]);
         }
      }
      else
      {
         assert(type() == LEAVE);

         if(m_pricingViolUpToDate)
            inf = m_pricingViol;

         for(int i = 0; i < dim(); i++)
         {
            if((*theCoPvec)[i] > (*theCoUbound)[i])
               inf = SOPLEX_MAX(inf, (*theCoPvec)[i] - (*theCoUbound)[i]);
            else if((*theCoPvec)[i] < (*theCoLbound)[i])
               inf = SOPLEX_MAX(inf, (*theCoLbound)[i] - (*theCoPvec)[i]);
         }

         for(int i = 0; i < coDim(); i++)
         {
            if((*thePvec)[i] > (*theUbound)[i])
               inf = SOPLEX_MAX(inf, (*thePvec)[i] - (*theUbound)[i]);
            else if((*thePvec)[i] < (*theLbound)[i])
               inf = SOPLEX_MAX(inf, (*theLbound)[i] - (*thePvec)[i]);
         }
      }

      return inf;
   }